

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O2

void intgemm::kernel_quantize_test<(intgemm::CPUType)4>(void)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 in_XMM2 [16];
  int local_f4 [3];
  AlignedVector<int> output;
  AlignedVector<float> input;
  SourceLineInfo local_c8;
  StringRef local_b8;
  BinaryExpr<const_int_&,_const_int_&> local_a8;
  AssertionHandler catchAssertionHandler;
  
  if (3 < kCPU) {
    AlignedVector<float>::AlignedVector(&input,0x10,0x40);
    AlignedVector<int>::AlignedVector(&output,0x10,0x40);
    fVar5 = 0.0;
    for (lVar2 = 0; input.size_ << 2 != lVar2; lVar2 = lVar2 + 4) {
      *(float *)((long)input.mem_ + lVar2) = fVar5;
      fVar5 = fVar5 + 1.0;
    }
    auVar4 = vaddps_avx512f(*(undefined1 (*) [64])input.mem_,*(undefined1 (*) [64])input.mem_);
    auVar4 = vcvtps2dq_avx512f(auVar4);
    *(undefined1 (*) [64])output.mem_ = auVar4;
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < output.size_; uVar3 = uVar3 + 1) {
      local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_a8.super_ITransientExpression.m_isBinaryExpression = true;
      local_a8.super_ITransientExpression.m_result = false;
      local_a8.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/quantize_test.cc"
      ;
      local_c8.line = 0x19;
      Catch::StringRef::StringRef(&local_b8,"output[i] == int(i*2.f)");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_a8,&local_c8,local_b8,ContinueOnFailure)
      ;
      local_c8.file = (char *)((long)output.mem_ + lVar2);
      auVar1 = vcvtusi2ss_avx512f(in_XMM2,uVar3);
      local_f4[0] = (int)(auVar1._0_4_ + auVar1._0_4_);
      Catch::ExprLhs<int_const&>::operator==(&local_a8,(ExprLhs<int_const&> *)&local_c8,local_f4);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_a8.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      lVar2 = lVar2 + 4;
    }
    free(output.mem_);
    free(input.mem_);
  }
  return;
}

Assistant:

void kernel_quantize_test() {
  if (kCPU < CPUType_)
    return;

  using input_vec_t = vector_t<CPUType_, float>;
  using output_vec_t = vector_t<CPUType_, int>;

  AlignedVector<float> input(sizeof(input_vec_t) / sizeof(float));
  AlignedVector<int> output(sizeof(output_vec_t) / sizeof(int));

  std::iota(input.begin(), input.end(), 0.0f);
  auto quant_mult = set1_ps<input_vec_t>(2.f);

  *output.template as<output_vec_t>() = kernels::quantize(*input.template as<input_vec_t>(), quant_mult);
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int(i*2.f));
}